

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void * __thiscall dgMeshEffect::GetFirstPoint(dgMeshEffect *this)

{
  dgTreeNode *node;
  Iterator local_18;
  
  local_18.m_tree = (dgTree<dgEdge,_long> *)this;
  local_18.m_ptr = &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this)->super_dgRedBackNode
  ;
  while (((dgTreeNode *)local_18.m_ptr != (dgTreeNode *)0x0 &&
         ((((dgTreeNode *)local_18.m_ptr)->m_info).m_incidentFace < 1))) {
    dgTree<dgEdge,_long>::Iterator::operator++(&local_18,0);
  }
  return local_18.m_ptr;
}

Assistant:

void* dgMeshEffect::GetFirstPoint ()
{
	Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgTreeNode* const node = iter.GetNode();
		dgEdge* const edge = &node->GetInfo();
		if (edge->m_incidentFace > 0) {
			return node;
		}
	}
	return NULL; 
}